

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oid.c
# Opt level: O0

int oid_subidentifier_encode_into(uchar **p,uchar *bound,uint value)

{
  size_t sVar1;
  ulong local_38;
  size_t i;
  size_t num_bytes;
  uint value_local;
  uchar *bound_local;
  uchar **p_local;
  
  sVar1 = oid_subidentifier_num_bytes(value);
  if ((ulong)((long)bound - (long)*p) < sVar1) {
    p_local._4_4_ = -0xb;
  }
  else {
    (*p)[sVar1 - 1] = (byte)value & 0x7f;
    num_bytes._4_4_ = value >> 7;
    for (local_38 = 2; local_38 <= sVar1; local_38 = local_38 + 1) {
      (*p)[sVar1 - local_38] = (byte)num_bytes._4_4_ & 0x7f | 0x80;
      num_bytes._4_4_ = num_bytes._4_4_ >> 7;
    }
    *p = *p + sVar1;
    p_local._4_4_ = 0;
  }
  return p_local._4_4_;
}

Assistant:

static int oid_subidentifier_encode_into(unsigned char **p,
                                         unsigned char *bound,
                                         unsigned int value)
{
    size_t num_bytes = oid_subidentifier_num_bytes(value);

    if ((size_t) (bound - *p) < num_bytes) {
        return MBEDTLS_ERR_OID_BUF_TOO_SMALL;
    }
    (*p)[num_bytes - 1] = (unsigned char) (value & 0x7f);
    value >>= 7;

    for (size_t i = 2; i <= num_bytes; i++) {
        (*p)[num_bytes - i] = 0x80 | (unsigned char) (value & 0x7f);
        value >>= 7;
    }
    *p += num_bytes;

    return 0;
}